

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_136b449::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char **ppcVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  uint uVar9;
  string *psVar10;
  undefined8 uVar11;
  string *psVar12;
  ulong uVar13;
  uint *puVar14;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  BOM BVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  undefined1 uVar19;
  int iVar20;
  undefined8 unaff_RBP;
  char cVar21;
  undefined4 uVar22;
  size_type sVar23;
  undefined4 uVar24;
  uint uVar25;
  string *sr;
  pointer pbVar26;
  bool bVar27;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view value;
  int limit_output;
  string output;
  int limit_input;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  ifstream fin;
  RegularExpression regex;
  int local_574;
  char *local_570;
  uint local_564;
  ulong local_560;
  string local_558;
  uint local_534;
  uint local_530;
  int local_52c;
  string *local_528;
  undefined8 local_520;
  ulong local_518;
  char *local_510;
  string local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined8 local_4c8;
  ulong local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  string local_498;
  BOM local_474;
  ulong local_470;
  undefined1 local_468 [24];
  char local_450 [8];
  char *local_448;
  undefined8 local_440;
  RegularExpression local_260;
  
  pbVar26 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar26) < 0x41) {
    ppcVar1 = local_260.regmatch.startp + 2;
    local_260.regmatch.startp[0] = (char *)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"STRINGS requires a file name and output variable","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((char **)local_260.regmatch.startp[0] != ppcVar1) {
      operator_delete(local_260.regmatch.startp[0],(ulong)(local_260.regmatch.startp[2] + 1));
    }
    return (bool)0;
  }
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  pcVar2 = pbVar26[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_498,pcVar2,pcVar2 + pbVar26[1]._M_string_length);
  bVar6 = cmsys::SystemTools::FileIsFullPath(&local_498);
  if (!bVar6) {
    psVar10 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    pbVar26 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_260.regmatch.startp[1] = (psVar10->_M_dataplus)._M_p;
    local_260.regmatch.startp[0] = (char *)psVar10->_M_string_length;
    local_260.regmatch.startp[2] = (char *)0x0;
    local_468._16_8_ = local_450;
    local_468._0_8_ = (pointer)0x0;
    local_468._8_8_ = (pointer)0x1;
    local_450[0] = 0x2f;
    local_260.regmatch.startp[3] = (char *)0x1;
    local_260.regmatch.startp[5] = (char *)0x0;
    local_260.regmatch.startp[7] = pbVar26[1]._M_dataplus._M_p;
    local_260.regmatch.startp[6] = (char *)pbVar26[1]._M_string_length;
    local_260.regmatch.startp[8] = (char *)0x0;
    views._M_len = 3;
    views._M_array = (iterator)&local_260;
    local_260.regmatch.startp[4] = (char *)local_468._16_8_;
    cmCatViews(&local_508,views);
    std::__cxx11::string::operator=((string *)&local_498,(string *)&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
  }
  psVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_52c = -1;
  local_574 = -1;
  local_260.regmust = (char *)0x0;
  local_510 = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (0x60 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10)) {
    bVar6 = true;
    uVar25 = 3;
    uVar17 = 3;
    local_564 = 0;
    local_530 = 0;
    local_520 = (pointer)((ulong)local_520._4_4_ << 0x20);
    local_518 = 0;
    uVar22 = 0;
    local_570 = (char *)((ulong)local_570 & 0xffffffff00000000);
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    local_4c0 = 0;
    local_528 = psVar10;
LAB_003c285c:
    do {
      uVar25 = uVar25 + 1;
      iVar7 = std::__cxx11::string::compare((char *)(psVar10 + uVar17));
      if (iVar7 == 0) {
        uVar22 = 1;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 2;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 3;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 4;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 5;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 7;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      uVar11 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar17));
      uVar24 = 0;
      if ((int)uVar11 == 0) {
        local_4c0 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
        uVar22 = 0;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) goto code_r0x003c2928;
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17));
      if (iVar7 == 0) {
        uVar22 = 8;
        uVar16 = local_564;
        goto LAB_003c2a05;
      }
      puVar14 = &switchD_003c29cb::switchdataD_008b076c;
      switch(uVar22) {
      case 1:
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                                "%d",&local_52c);
        if ((iVar7 != 1) || (uVar22 = 0, uVar16 = local_564, local_52c < 0)) {
          cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                    ((string *)local_468,(char (*) [35])"STRINGS option LIMIT_INPUT value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar17,
                     (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003c3827;
        }
        break;
      case 2:
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                                "%d",&local_574);
        if ((iVar7 != 1) || (uVar22 = 0, uVar16 = local_564, local_574 < 0)) {
          cmStrCat<char_const(&)[36],std::__cxx11::string_const&,char_const(&)[30]>
                    ((string *)local_468,(char (*) [36])"STRINGS option LIMIT_OUTPUT value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar17,
                     (char (*) [30])"\" is not an unsigned integer.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003c3827;
        }
        break;
      case 3:
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                                "%d",&local_508);
        if (iVar7 == 1) {
          local_520 = (pointer)CONCAT44(local_520._4_4_,(uint)local_508._M_dataplus._M_p);
          uVar22 = uVar24;
          uVar16 = local_564;
          if (-1 < (int)(uint)local_508._M_dataplus._M_p) break;
        }
        cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)local_468,(char (*) [35])"STRINGS option LIMIT_COUNT value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar17,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003c3827;
      case 4:
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                                "%d",&local_508);
        if (iVar7 == 1) {
          uVar22 = uVar24;
          uVar16 = (uint)local_508._M_dataplus._M_p;
          if (-1 < (int)(uint)local_508._M_dataplus._M_p) break;
        }
        cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)local_468,(char (*) [38])"STRINGS option LENGTH_MINIMUM value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar17,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003c3827;
      case 5:
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                                "%d",&local_508);
        if (iVar7 == 1) {
          local_530 = (uint)local_508._M_dataplus._M_p;
          uVar22 = uVar24;
          uVar16 = local_564;
          if (-1 < (int)(uint)local_508._M_dataplus._M_p) break;
        }
        cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)local_468,(char (*) [38])"STRINGS option LENGTH_MAXIMUM value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar17,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003c3827;
      default:
        cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[2]>
                  ((string *)local_468,(char (*) [33])"STRINGS given unknown argument \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar17,(char (*) [2])0x8d0f9c);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003c3827:
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
        }
        uVar19 = 0;
        goto LAB_003c3622;
      case 7:
        bVar27 = cmsys::RegularExpression::compile
                           (&local_260,
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p);
        if (!bVar27) {
          cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[25]>
                    ((string *)local_468,(char (*) [29])"STRINGS option REGEX value \"",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar17,
                     (char (*) [25])"\" could not be compiled.");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003c3827;
        }
        PVar8 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0159,false);
        local_518 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
        if (PVar8 != OLD) {
          uVar22 = uVar24;
          uVar16 = local_564;
          if (PVar8 != WARN) break;
          pcVar3 = status->Makefile;
          local_468._0_8_ = local_468 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,"CMAKE_POLICY_WARNING_CMP0159","");
          bVar6 = cmMakefile::PolicyOptionalWarningEnabled(pcVar3,(string *)local_468);
          id = extraout_EDX;
          if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
            operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
            id = extraout_EDX_00;
          }
          if (bVar6) {
            pcVar3 = status->Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_508,(cmPolicies *)0x9f,id);
            local_558._M_dataplus._M_p._0_1_ = 10;
            cmStrCat<std::__cxx11::string,char,char_const(&)[63]>
                      ((string *)local_468,&local_508,(char *)&local_558,
                       (char (*) [63])
                       "For compatibility, CMake is leaving CMAKE_MATCH_<n> unchanged.");
            cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_468);
            if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
              operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        bVar6 = false;
        uVar22 = 0;
        uVar16 = local_564;
        break;
      case 8:
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar17));
        if (iVar7 == 0) {
          local_570 = (char *)CONCAT44(local_570._4_4_,1);
          uVar22 = uVar24;
          uVar16 = local_564;
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar17));
          if (iVar7 == 0) {
            local_570 = (char *)CONCAT44(local_570._4_4_,3);
            uVar22 = uVar24;
            uVar16 = local_564;
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar17));
            if (iVar7 == 0) {
              local_570 = (char *)CONCAT44(local_570._4_4_,2);
              uVar22 = uVar24;
              uVar16 = local_564;
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar17));
              if (iVar7 == 0) {
                local_570 = (char *)CONCAT44(local_570._4_4_,5);
                uVar22 = uVar24;
                uVar16 = local_564;
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar17));
                local_570 = (char *)CONCAT44(local_570._4_4_,4);
                uVar22 = 0;
                uVar16 = local_564;
                if (iVar7 != 0) {
                  cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[18]>
                            ((string *)local_468,(char (*) [26])"STRINGS option ENCODING \"",
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar17,
                             (char (*) [18])"\" not recognized.");
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_003c3827;
                }
              }
            }
          }
        }
      }
LAB_003c2a05:
      local_564 = uVar16;
      uVar17 = (ulong)uVar25;
      psVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 5) <= uVar17)
      {
        local_510 = (char *)(ulong)local_564;
        psVar10 = local_528;
        BVar15 = (BOM)local_570;
        if ((char)unaff_RBP != '\0') goto LAB_003c2d60;
        goto LAB_003c2e15;
      }
    } while( true );
  }
  bVar6 = true;
  local_530 = 0;
  local_520 = (pointer)((ulong)local_520._4_4_ << 0x20);
  local_518 = 0;
  BVar15 = BOM_None;
  local_4c0 = 0;
LAB_003c2d60:
  psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
  local_468._8_8_ = (psVar12->_M_dataplus)._M_p;
  local_468._0_8_ = psVar12->_M_string_length;
  local_468._16_8_ = (char *)0x0;
  local_450[0] = '(';
  local_450[1] = '\0';
  local_450[2] = '\0';
  local_450[3] = '\0';
  local_450[4] = '\0';
  local_450[5] = '\0';
  local_450[6] = '\0';
  local_450[7] = '\0';
  local_448 = "/CMakeFiles/FileCommandStringsBinaryFile";
  local_440 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_468;
  cmCatViews(&local_508,views_00);
  bVar27 = cmHexFileConverter::TryConvert(&local_498,&local_508);
  if (bVar27) {
    std::__cxx11::string::_M_assign((string *)&local_498);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
LAB_003c2e15:
  std::ifstream::ifstream(local_468,local_498._M_dataplus._M_p,_S_in);
  bVar27 = (*(byte *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) == 0;
  uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar27);
  if (!bVar27) {
    local_508._M_dataplus._M_p = (pointer)0xe;
    local_508._M_string_length = 0x8b34f8;
    local_508.field_2._M_allocated_capacity = 0;
    local_508.field_2._8_8_ = local_498._M_string_length;
    local_4e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p;
    local_4e0 = 0;
    local_4d8 = 0x11;
    local_4d0 = "\" cannot be read.";
    local_4c8 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)&local_508;
    cmCatViews(&local_558,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,
                      CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                               local_558.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_003c3615;
  }
  local_534 = (uint)uVar17;
  local_474 = cmsys::FStream::ReadBOM((istream *)local_468);
  local_528 = psVar10 + 2;
  if (local_474 == BOM_None) {
    local_474 = BVar15;
  }
  if (BVar15 != BOM_None) {
    local_474 = BVar15;
  }
  local_564 = 3;
  if ((local_474 & ~BOM_UTF8) != BOM_UTF32BE) {
    local_564 = (uint)((local_474 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508._M_string_length = 0;
  local_508.field_2._M_allocated_capacity =
       local_508.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_470 = (ulong)local_520 & 0xffffffff;
  local_570 = (char *)(ulong)local_530;
  local_560 = 0;
  do {
    BVar15 = local_474;
    if (((int)local_520 != 0) &&
       (uVar13 = (long)local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_470 <= uVar13))
    goto LAB_003c3453;
    if (((-1 < local_52c) && (iVar7 = std::istream::tellg(), local_52c <= iVar7)) ||
       ((*(byte *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) != 0)) break;
    local_558._M_string_length = 0;
    local_558.field_2._M_local_buf[0] = '\0';
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    uVar25 = std::istream::get();
    cVar21 = (char)local_468;
    for (uVar16 = local_564; uVar16 != 0; uVar16 = uVar16 - 1) {
      uVar9 = std::istream::get();
      if ((*(byte *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) != 0) {
        std::istream::putback(cVar21);
        break;
      }
      uVar25 = uVar25 << 8 | uVar9;
    }
    pcVar18 = local_570;
    if (BVar15 == BOM_UTF32LE) {
      uVar25 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 | uVar25 << 0x18;
    }
    else if (BVar15 == BOM_UTF16LE) {
      uVar25 = (uint)(ushort)((ushort)uVar25 << 8 | (ushort)uVar25 >> 8);
    }
    if (uVar25 == 0xd) {
      bVar27 = false;
    }
    else {
      if (uVar25 < 0x100) {
        iVar7 = isprint(uVar25);
        if (((uVar25 != 9) && (iVar7 == 0)) && ((uVar25 == 10 & (byte)local_4c0) == 0))
        goto LAB_003c30a8;
        std::__cxx11::string::push_back((char)&local_558);
      }
      else {
LAB_003c30a8:
        if (BVar15 == BOM_UTF8) {
          uVar17 = 0;
          iVar7 = 2;
          do {
            iVar20 = iVar7;
            uVar16 = HandleStringsCommand::utf8_check_table[uVar17][0] & uVar25;
            uVar13 = uVar17 + 1;
            uVar9 = (uint)HandleStringsCommand::utf8_check_table[uVar17][1];
            if (uVar16 == uVar9) break;
            bVar27 = uVar17 < 2;
            uVar17 = uVar13;
            iVar7 = iVar20 + 1;
          } while (bVar27);
          uVar5 = (int)uVar13 + 1;
          if (uVar16 != uVar9) {
            uVar5 = 0;
          }
          if (uVar16 == uVar9) {
            iVar7 = 0;
            do {
              bVar27 = iVar7 != 0;
              iVar7 = iVar7 + -1;
              if ((bVar27) &&
                 ((uVar25 = std::istream::get(), (uVar25 & 0xc0) != 0x80 ||
                  ((*(uint *)((long)&local_448 + *(long *)(local_468._0_8_ + -0x18)) & 5) != 0)))) {
                std::istream::putback(cVar21);
                break;
              }
              std::__cxx11::string::push_back((char)&local_558);
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          pcVar18 = local_570;
          if (local_558._M_string_length != uVar5) {
            if (local_558._M_string_length != 1) {
              uVar17 = 1;
              do {
                std::istream::putback(cVar21);
                bVar27 = uVar17 < local_558._M_string_length - 1;
                uVar17 = (ulong)((int)uVar17 + 1);
              } while (bVar27);
            }
            local_558._M_string_length = 0;
            *local_558._M_dataplus._M_p = '\0';
            pcVar18 = local_570;
          }
        }
      }
      if (uVar25 == 10 && (local_4c0 & 1) == 0) {
        if ((local_508._M_string_length < local_510) ||
           (((local_518 & 1) != 0 &&
            (bVar27 = cmsys::RegularExpression::find
                                (&local_260,local_508._M_dataplus._M_p,&local_260.regmatch), !bVar27
            )))) {
LAB_003c3337:
          local_508._M_string_length = 0;
          *local_508._M_dataplus._M_p = '\0';
          goto LAB_003c334e;
        }
        if (bVar6) {
          cmMakefile::ClearMatches(status->Makefile);
          cmMakefile::StoreMatches(status->Makefile,&local_260);
        }
        uVar25 = (int)local_560 + (int)local_508._M_string_length + 1;
        local_560 = (ulong)uVar25;
        if ((local_574 < 0) || (bVar27 = true, (int)uVar25 < local_574)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4b8,&local_508);
          goto LAB_003c3337;
        }
      }
      else {
        if (local_558._M_string_length == 0) {
          if (((char *)local_508._M_string_length != (char *)0x0 &&
               local_510 <= local_508._M_string_length) &&
             (((local_518 & 1) == 0 ||
              (bVar27 = cmsys::RegularExpression::find
                                  (&local_260,local_508._M_dataplus._M_p,&local_260.regmatch),
              bVar27)))) {
            if (bVar6) {
              cmMakefile::ClearMatches(status->Makefile);
              cmMakefile::StoreMatches(status->Makefile,&local_260);
            }
            uVar25 = (int)local_560 + (int)local_508._M_string_length + 1;
            local_560 = (ulong)uVar25;
            if ((-1 < local_574) && (bVar27 = true, local_574 <= (int)uVar25)) goto LAB_003c33fa;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_4b8,&local_508);
          }
          goto LAB_003c3337;
        }
        std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_558._M_dataplus._M_p);
LAB_003c334e:
        bVar27 = false;
        if ((local_530 == 0) || ((char *)local_508._M_string_length != pcVar18)) goto LAB_003c3411;
        if (((uint)local_510 <= (uint)pcVar18) &&
           (((local_518 & 1) == 0 ||
            (bVar27 = cmsys::RegularExpression::find
                                (&local_260,local_508._M_dataplus._M_p,&local_260.regmatch), bVar27)
            ))) {
          if (bVar6) {
            cmMakefile::ClearMatches(status->Makefile);
            cmMakefile::StoreMatches(status->Makefile,&local_260);
          }
          uVar25 = (int)local_560 + (int)local_508._M_string_length + 1;
          local_560 = (ulong)uVar25;
          if ((-1 < local_574) && (bVar27 = true, local_574 <= (int)uVar25)) goto LAB_003c33fa;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4b8,&local_508);
        }
        bVar27 = false;
      }
LAB_003c33fa:
      local_508._M_string_length = 0;
      *local_508._M_dataplus._M_p = '\0';
    }
LAB_003c3411:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,
                      CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                               local_558.field_2._M_local_buf[0]) + 1);
    }
  } while (!bVar27);
  if ((int)local_520 == 0) {
    uVar17 = (ulong)local_534;
    iVar7 = (int)local_560;
LAB_003c347e:
    psVar10 = local_528;
    if ((((char *)local_508._M_string_length != (char *)0x0) &&
        (local_510 <= local_508._M_string_length)) &&
       (((local_518 & 1) == 0 ||
        (bVar27 = cmsys::RegularExpression::find
                            (&local_260,local_508._M_dataplus._M_p,&local_260.regmatch), bVar27))))
    {
      if (bVar6) {
        cmMakefile::ClearMatches(status->Makefile);
        cmMakefile::StoreMatches(status->Makefile,&local_260);
      }
      if ((local_574 < 0) || ((int)local_508._M_string_length + iVar7 + 1 < local_574)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_4b8,&local_508);
      }
    }
  }
  else {
    uVar13 = (long)local_4b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_4b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_003c3453:
    uVar17 = (ulong)local_534;
    iVar7 = (int)local_560;
    psVar10 = local_528;
    if (uVar13 < local_470) goto LAB_003c347e;
  }
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  local_558._M_string_length = 0;
  local_558.field_2._M_local_buf[0] = '\0';
  local_520 = local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar26 = local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::append((char *)&local_558);
      sVar4 = pbVar26->_M_string_length;
      if (sVar4 != 0) {
        pcVar2 = (pbVar26->_M_dataplus)._M_p;
        sVar23 = 0;
        do {
          cVar21 = (char)&local_558;
          if (pcVar2[sVar23] == ';') {
            std::__cxx11::string::push_back(cVar21);
          }
          std::__cxx11::string::push_back(cVar21);
          sVar23 = sVar23 + 1;
        } while (sVar4 != sVar23);
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 != local_520);
    uVar17 = (ulong)local_534;
    psVar10 = local_528;
  }
  value._M_str = local_558._M_dataplus._M_p;
  value._M_len = local_558._M_string_length;
  cmMakefile::AddDefinition(status->Makefile,psVar10,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,
                    CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                             local_558.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4b8);
LAB_003c3615:
  uVar19 = (undefined1)uVar17;
  std::ifstream::~ifstream(local_468);
LAB_003c3622:
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar19;
code_r0x003c2928:
  uVar17 = (ulong)uVar25;
  psVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar22 = 0;
  unaff_RBP = 0;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 >> 5) <= uVar17)
  goto LAB_003c2e03;
  goto LAB_003c285c;
LAB_003c2e03:
  local_510 = (char *)(ulong)local_564;
  psVar10 = local_528;
  BVar15 = (BOM)local_570;
  goto LAB_003c2e15;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool store_regex = true;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0159)) {
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          // store_regex = true
          break;
        case cmPolicies::WARN:
          if (status.GetMakefile().PolicyOptionalWarningEnabled(
                "CMAKE_POLICY_WARNING_CMP0159")) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0159), '\n',
                       "For compatibility, CMake is leaving CMAKE_MATCH_<n> "
                       "unchanged."));
          }
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          store_regex = false;
          break;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    if (store_regex) {
      status.GetMakefile().ClearMatches();
      status.GetMakefile().StoreMatches(regex);
    }
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}